

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.h
# Opt level: O3

void __thiscall spsc_queue<int>::spsc_queue(spsc_queue<int> *this,size_t prealloc)

{
  node *pnVar1;
  size_t sVar2;
  
  pnVar1 = (node *)operator_new(0x10);
  pnVar1->next_ = (node *)0x0;
  this->tail_copy_ = pnVar1;
  this->first_ = pnVar1;
  this->head_ = pnVar1;
  this->tail_ = pnVar1;
  sVar2 = prealloc;
  if (prealloc != 0) {
    do {
      pnVar1 = alloc_node(this);
      pnVar1->next_ = (node *)0x0;
      pnVar1->value_ = 0;
      this->head_->next_ = pnVar1;
      this->head_ = pnVar1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
    do {
      if (this->tail_->next_ != (node *)0x0) {
        this->tail_ = this->tail_->next_;
      }
      prealloc = prealloc - 1;
    } while (prealloc != 0);
  }
  return;
}

Assistant:

explicit spsc_queue(size_t prealloc)
  {
      node* n = new node;
      n->next_ = 0;
      tail_ = head_ = first_ = tail_copy_ = n;

      // [CD] Not (at all) the most efficient way to pre-allocate memory, but it works
      T dummy = T();
      for (size_t i = 0; i != prealloc; ++i) {
          enqueue(dummy);
      }
      for (size_t i = 0; i != prealloc; ++i) {
          try_dequeue(dummy);
      }
  }